

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  ImFontGlyph *__src;
  ImFontAtlas *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ImFontGlyph *__dest;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar16 [64];
  float advance_x_original;
  undefined1 in_register_00001504 [12];
  
  auVar16._4_60_ = in_register_000012c4;
  auVar16._0_4_ = y1;
  auVar14._4_60_ = in_register_00001284;
  auVar14._0_4_ = x1;
  auVar10 = auVar14._0_16_;
  auVar12._4_60_ = in_register_00001244;
  auVar12._0_4_ = y0;
  auVar11._4_60_ = in_register_00001204;
  auVar11._0_4_ = x0;
  auVar13 = auVar11._0_16_;
  if (cfg != (ImFontConfig *)0x0) {
    auVar15 = vminss_avx(ZEXT416((uint)cfg->GlyphMaxAdvanceX),ZEXT416((uint)advance_x));
    uVar4 = vcmpss_avx512f(ZEXT416((uint)advance_x),ZEXT416((uint)cfg->GlyphMinAdvanceX),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    fVar8 = (float)((uint)bVar5 * (int)cfg->GlyphMinAdvanceX + (uint)!bVar5 * auVar15._0_4_);
    bVar5 = cfg->PixelSnapH;
    if ((fVar8 != advance_x) || (NAN(fVar8) || NAN(advance_x))) {
      fVar9 = (fVar8 - advance_x) * 0.5;
      auVar13 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar9));
      fVar9 = (float)((uint)(bVar5 & 1) * auVar13._0_4_ + (uint)!(bool)(bVar5 & 1) * (int)fVar9);
      auVar13 = ZEXT416((uint)(fVar9 + x0));
      auVar10 = ZEXT416((uint)(fVar9 + x1));
    }
    auVar15 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar8 + 0.5)));
    advance_x = (float)((uint)(bVar5 & 1) * auVar15._0_4_ + (uint)!(bool)(bVar5 & 1) * (int)fVar8) +
                (cfg->GlyphExtraSpacing).x;
  }
  iVar1 = (this->Glyphs).Size;
  iVar6 = (this->Glyphs).Capacity;
  iVar7 = iVar1 + 1;
  if (iVar1 < iVar6) {
    __dest = (this->Glyphs).Data;
  }
  else {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar6 * 0x28);
    __src = (this->Glyphs).Data;
    if (__src != (ImFontGlyph *)0x0) {
      memcpy(__dest,__src,(long)(this->Glyphs).Size * 0x28);
      ImGui::MemFree((this->Glyphs).Data);
    }
    (this->Glyphs).Data = __dest;
    (this->Glyphs).Capacity = iVar6;
  }
  uVar4 = vcmpps_avx512vl(auVar12._0_16_,auVar16._0_16_,4);
  (this->Glyphs).Size = iVar7;
  uVar3 = vcmpps_avx512vl(auVar13,auVar10,4);
  *(uint *)(__dest + iVar1) = (uint)codepoint * 4 + ((uint)uVar4 & (uint)uVar3 & 1) * 2;
  __dest[iVar1].X0 = auVar13._0_4_;
  __dest[iVar1].Y0 = y0;
  __dest[iVar1].X1 = auVar10._0_4_;
  __dest[iVar1].Y1 = y1;
  __dest[iVar1].U0 = u0;
  __dest[iVar1].V0 = v0;
  __dest[iVar1].U1 = u1;
  __dest[iVar1].V1 = v1;
  __dest[iVar1].AdvanceX = advance_x;
  pIVar2 = this->ContainerAtlas;
  iVar1 = pIVar2->TexGlyphPadding;
  this->DirtyLookupTables = true;
  auVar13._0_4_ = (float)pIVar2->TexWidth;
  auVar13._4_12_ = in_register_00001504;
  auVar15._0_4_ = (float)pIVar2->TexHeight;
  auVar15._4_12_ = in_register_00001504;
  auVar10 = ZEXT416((uint)((float)iVar1 + 0.99));
  auVar13 = vfmadd213ss_fma(auVar13,ZEXT416((uint)(u1 - u0)),auVar10);
  auVar10 = vfmadd213ss_fma(auVar15,ZEXT416((uint)(v1 - v0)),auVar10);
  this->MetricsTotalSurface = this->MetricsTotalSurface + (int)auVar10._0_4_ * (int)auVar13._0_4_;
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}